

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_greedy_extDict_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  BYTE *pBVar2;
  U32 *pUVar3;
  char cVar4;
  undefined8 uVar5;
  int iVar6;
  int *iLimit;
  size_t sVar7;
  BYTE *pBVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  int *piVar12;
  BYTE *pBVar13;
  int *piVar14;
  U32 UVar15;
  long lVar16;
  int *piVar17;
  seqDef *psVar18;
  uint uVar19;
  U32 UVar20;
  ulong uVar21;
  U32 UVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  U32 UVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  size_t ofbCandidate;
  U32 maxDistance;
  U32 local_c4;
  size_t local_a8;
  ZSTD_matchState_t *local_a0;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  ulong local_88;
  int *local_80;
  seqStore_t *local_78;
  BYTE *local_70;
  BYTE *local_68;
  ulong local_60;
  U32 local_54;
  BYTE *local_50;
  int *local_48;
  int *local_40;
  U32 *local_38;
  
  pBVar2 = (ms->window).base;
  local_70 = (ms->window).dictBase;
  uVar10 = (ms->window).dictLimit;
  local_88 = (ulong)uVar10;
  local_50 = (BYTE *)(ulong)(ms->window).lowLimit;
  local_98 = (ms->cParams).windowLog;
  local_8c = (ms->cParams).minMatch;
  if (5 < local_8c) {
    local_8c = 6;
  }
  if (local_8c < 5) {
    local_8c = 4;
  }
  local_90 = (ms->cParams).searchLog;
  uVar23 = 6;
  if (local_90 < 6) {
    uVar23 = local_90;
  }
  if (uVar23 < 5) {
    uVar23 = 4;
  }
  UVar22 = *rep;
  UVar26 = rep[1];
  ms->lazySkipping = 0;
  local_68 = pBVar2 + local_88;
  local_94 = CONCAT31(local_94._1_3_,local_68 == (BYTE *)src);
  local_80 = (int *)((long)src + (srcSize - 0x10));
  uVar25 = ms->nextToUpdate;
  uVar21 = (ulong)uVar25;
  uVar19 = ((int)local_80 - (int)(pBVar2 + uVar21)) + 1;
  uVar11 = 8;
  if (uVar19 < 8) {
    uVar11 = uVar19;
  }
  if (local_80 < pBVar2 + uVar21) {
    uVar11 = 0;
  }
  bVar9 = (byte)uVar23;
  local_a0 = ms;
  local_78 = seqStore;
  local_38 = rep;
  if (uVar25 < uVar11 + uVar25) {
    if (0x20 < ms->rowHashLog + 8) {
LAB_00162201:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4741,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    pUVar3 = ms->hashTable;
    pBVar13 = ms->tagTable;
    uVar29 = ms->hashSalt;
    cVar4 = (char)ms->rowHashLog;
    local_60 = 0xcf1bbcdcbf9b0000;
    do {
      if (local_8c == 5) {
        uVar28 = *(long *)(pBVar2 + uVar21) * -0x30e4432345000000;
LAB_001618e8:
        uVar28 = (uVar28 ^ uVar29) >> (0x38U - cVar4 & 0x3f);
      }
      else {
        if (local_8c == 6) {
          uVar28 = *(long *)(pBVar2 + uVar21) * -0x30e4432340650000;
          goto LAB_001618e8;
        }
        uVar28 = (ulong)((*(int *)(pBVar2 + uVar21) * -0x61c8864f ^ (uint)uVar29) >>
                        (0x18U - cVar4 & 0x1f));
      }
      uVar19 = ((uint)(uVar28 >> 8) & 0xffffff) << (bVar9 & 0x1f);
      if (((ulong)(pUVar3 + uVar19) & 0x3f) != 0) {
LAB_00162109:
        __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76a2,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      if (((ulong)(pBVar13 + uVar19) & ~(-1L << (bVar9 & 0x3f))) != 0) {
LAB_001620ea:
        __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76a3,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      ms->hashCache[(uint)uVar21 & 7] = (U32)uVar28;
      uVar21 = uVar21 + 1;
    } while (uVar11 + uVar25 != uVar21);
  }
  iLimit = (int *)(srcSize + (long)src);
  piVar17 = (int *)((ulong)(local_68 == (BYTE *)src) + (long)src);
  if (piVar17 < local_80) {
    local_48 = (int *)(local_70 + local_88);
    local_50 = local_50 + (long)local_70;
    local_94 = 1 << ((byte)local_98 & 0x1f);
    local_98 = uVar10 - 1;
    local_40 = iLimit + -8;
    local_60 = ~(-1L << (bVar9 & 0x3f));
    do {
      iVar6 = ((int)piVar17 - (int)pBVar2) + 1;
      UVar20 = (local_a0->window).lowLimit;
      UVar15 = iVar6 - local_94;
      if (iVar6 - UVar20 <= local_94) {
        UVar15 = UVar20;
      }
      if (local_a0->loadedDictEnd != 0) {
        UVar15 = UVar20;
      }
      uVar10 = iVar6 - UVar22;
      pBVar13 = pBVar2;
      if (uVar10 < (uint)local_88) {
        pBVar13 = local_70;
      }
      piVar14 = (int *)((long)piVar17 + 1);
      uVar25 = UVar26;
      local_c4 = UVar22;
      if (((local_98 - uVar10 < 3) || (iVar6 - UVar15 < UVar22)) ||
         (*piVar14 != *(int *)(pBVar13 + uVar10))) {
        local_a8 = 999999999;
        if (local_8c == 6) {
          if (uVar23 == 6) {
            uVar21 = ZSTD_RowFindBestMatch_extDict_6_6
                               (local_a0,(BYTE *)piVar17,(BYTE *)iLimit,&local_a8);
          }
          else if (uVar23 == 5) {
            uVar21 = ZSTD_RowFindBestMatch_extDict_6_5
                               (local_a0,(BYTE *)piVar17,(BYTE *)iLimit,&local_a8);
          }
          else {
            uVar21 = ZSTD_RowFindBestMatch_extDict_6_4
                               (local_a0,(BYTE *)piVar17,(BYTE *)iLimit,&local_a8);
          }
        }
        else if (local_8c == 5) {
          if (uVar23 == 6) {
            uVar21 = ZSTD_RowFindBestMatch_extDict_5_6
                               (local_a0,(BYTE *)piVar17,(BYTE *)iLimit,&local_a8);
          }
          else if (uVar23 == 5) {
            uVar21 = ZSTD_RowFindBestMatch_extDict_5_5
                               (local_a0,(BYTE *)piVar17,(BYTE *)iLimit,&local_a8);
          }
          else {
            uVar21 = ZSTD_RowFindBestMatch_extDict_5_4
                               (local_a0,(BYTE *)piVar17,(BYTE *)iLimit,&local_a8);
          }
        }
        else if (uVar23 == 6) {
          uVar21 = ZSTD_RowFindBestMatch_extDict_4_6
                             (local_a0,(BYTE *)piVar17,(BYTE *)iLimit,&local_a8);
        }
        else if (uVar23 == 5) {
          uVar21 = ZSTD_RowFindBestMatch_extDict_4_5
                             (local_a0,(BYTE *)piVar17,(BYTE *)iLimit,&local_a8);
        }
        else {
          uVar21 = ZSTD_RowFindBestMatch_extDict_4_4
                             (local_a0,(BYTE *)piVar17,(BYTE *)iLimit,&local_a8);
        }
        uVar29 = local_a8;
        piVar12 = piVar17;
        if (uVar21 == 0) {
          uVar29 = 1;
          piVar12 = piVar14;
        }
        piVar14 = piVar12;
        UVar20 = (U32)uVar29;
        if (3 < uVar21) {
          if (3 < local_a8) {
            uVar29 = (long)piVar17 + (3 - (long)(pBVar2 + local_a8));
            pBVar8 = local_68;
            pBVar13 = pBVar2;
            if ((uint)uVar29 < (uint)local_88) {
              pBVar8 = local_50;
              pBVar13 = local_70;
            }
            if ((src < piVar17) && (uVar29 = uVar29 & 0xffffffff, pBVar8 < pBVar13 + uVar29)) {
              pBVar13 = pBVar13 + uVar29;
              do {
                piVar17 = (int *)((long)piVar14 + -1);
                pBVar13 = pBVar13 + -1;
                if ((*(BYTE *)piVar17 != *pBVar13) ||
                   (uVar21 = uVar21 + 1, piVar14 = piVar17, piVar17 <= src)) break;
              } while (pBVar8 < pBVar13);
            }
            local_c4 = UVar20 - 3;
            uVar25 = UVar22;
          }
          goto LAB_00161c4c;
        }
        uVar21 = (long)piVar17 - (long)src;
        piVar17 = (int *)((long)piVar17 + (uVar21 >> 8) + 1);
        local_a0->lazySkipping = (uint)(0x8ff < uVar21);
      }
      else {
        piVar12 = iLimit;
        if (uVar10 < (uint)local_88) {
          piVar12 = local_48;
        }
        sVar7 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar17 + 5),(BYTE *)((long)(pBVar13 + uVar10) + 4),
                           (BYTE *)iLimit,(BYTE *)piVar12,local_68);
        uVar21 = sVar7 + 4;
        UVar20 = 1;
LAB_00161c4c:
        if (local_78->maxNbSeq <=
            (ulong)((long)local_78->sequences - (long)local_78->sequencesStart >> 3)) {
LAB_00162185:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_78->maxNbLit) {
LAB_00162166:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar29 = (long)piVar14 - (long)src;
        pBVar13 = local_78->lit;
        if (local_78->litStart + local_78->maxNbLit < pBVar13 + uVar29) {
LAB_00162128:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iLimit < piVar14) {
LAB_00162147:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_40 < piVar14) {
          ZSTD_safecopyLiterals(pBVar13,(BYTE *)src,(BYTE *)piVar14,(BYTE *)local_40);
LAB_00161cbf:
          local_78->lit = local_78->lit + uVar29;
          if (0xffff < uVar29) {
            if (local_78->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46a0,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_78->longLengthType = ZSTD_llt_literalLength;
            local_78->longLengthPos =
                 (U32)((ulong)((long)local_78->sequences - (long)local_78->sequencesStart) >> 3);
          }
        }
        else {
          uVar5 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar13 = *src;
          *(undefined8 *)(pBVar13 + 8) = uVar5;
          pBVar13 = local_78->lit;
          if (0x10 < uVar29) {
            if ((BYTE *)0xffffffffffffffe0 < pBVar13 + 0x10 + (-0x10 - ((long)src + 0x10))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar5 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar13 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar13 + 0x18) = uVar5;
            if (0x20 < (long)uVar29) {
              lVar16 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar16 + 0x20);
                uVar5 = puVar1[1];
                pBVar8 = pBVar13 + lVar16 + 0x20;
                *(undefined8 *)pBVar8 = *puVar1;
                *(undefined8 *)(pBVar8 + 8) = uVar5;
                puVar1 = (undefined8 *)((long)src + lVar16 + 0x30);
                uVar5 = puVar1[1];
                *(undefined8 *)(pBVar8 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar8 + 0x18) = uVar5;
                lVar16 = lVar16 + 0x20;
              } while (pBVar8 + 0x20 < pBVar13 + uVar29);
            }
            goto LAB_00161cbf;
          }
          local_78->lit = pBVar13 + uVar29;
        }
        psVar18 = local_78->sequences;
        psVar18->litLength = (U16)uVar29;
        psVar18->offBase = UVar20;
        if (uVar21 < 3) {
LAB_001621a4:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar21 - 3) {
          if (local_78->longLengthType != ZSTD_llt_none) {
LAB_001621c3:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_78->longLengthType = ZSTD_llt_matchLength;
          local_78->longLengthPos =
               (U32)((ulong)((long)psVar18 - (long)local_78->sequencesStart) >> 3);
        }
        psVar18->mlBase = (U16)(uVar21 - 3);
        psVar18 = psVar18 + 1;
        local_78->sequences = psVar18;
        if (local_a0->lazySkipping != 0) {
          uVar10 = local_a0->nextToUpdate;
          uVar29 = (ulong)uVar10;
          uVar11 = ((int)local_80 - (int)(pBVar2 + uVar29)) + 1;
          if (7 < uVar11) {
            uVar11 = 8;
          }
          if (local_80 < pBVar2 + uVar29) {
            uVar11 = 0;
          }
          local_54 = uVar25;
          if (uVar10 < uVar11 + uVar10) {
            if (0x20 < local_a0->rowHashLog + 8) goto LAB_00162201;
            pUVar3 = local_a0->hashTable;
            pBVar13 = local_a0->tagTable;
            uVar28 = local_a0->hashSalt;
            cVar4 = (char)local_a0->rowHashLog;
            do {
              if (local_8c == 5) {
                uVar24 = *(long *)(pBVar2 + uVar29) * -0x30e4432345000000;
LAB_00161e7a:
                uVar19 = (uint)((uVar24 ^ uVar28) >> (0x38U - cVar4 & 0x3f));
              }
              else {
                if (local_8c == 6) {
                  uVar24 = *(long *)(pBVar2 + uVar29) * -0x30e4432340650000;
                  goto LAB_00161e7a;
                }
                uVar19 = (*(int *)(pBVar2 + uVar29) * -0x61c8864f ^ (uint)uVar28) >>
                         (0x18U - cVar4 & 0x1f);
              }
              uVar27 = (uVar19 >> 8) << (bVar9 & 0x1f);
              if (((ulong)(pUVar3 + uVar27) & 0x3f) != 0) goto LAB_00162109;
              if ((local_60 & (ulong)(pBVar13 + uVar27)) != 0) goto LAB_001620ea;
              local_a0->hashCache[(uint)uVar29 & 7] = uVar19;
              uVar29 = uVar29 + 1;
            } while (uVar11 + uVar10 != uVar29);
          }
          local_a0->lazySkipping = 0;
        }
        piVar17 = (int *)((long)piVar14 + uVar21);
        src = piVar17;
        UVar26 = uVar25;
        UVar22 = local_c4;
        if (piVar17 <= local_80) {
          do {
            UVar15 = local_c4;
            iVar6 = (int)piVar17 - (int)pBVar2;
            UVar22 = (local_a0->window).lowLimit;
            UVar20 = iVar6 - local_94;
            if (iVar6 - UVar22 <= local_94) {
              UVar20 = UVar22;
            }
            if (local_a0->loadedDictEnd != 0) {
              UVar20 = UVar22;
            }
            uVar10 = iVar6 - uVar25;
            pBVar13 = pBVar2;
            if (uVar10 < (uint)local_88) {
              pBVar13 = local_70;
            }
            src = piVar17;
            UVar26 = uVar25;
            UVar22 = UVar15;
            if (((local_98 - uVar10 < 3) || (iVar6 - UVar20 < uVar25)) ||
               (*piVar17 != *(int *)(pBVar13 + uVar10))) break;
            piVar14 = iLimit;
            if (uVar10 < (uint)local_88) {
              piVar14 = local_48;
            }
            sVar7 = ZSTD_count_2segments
                              ((BYTE *)(piVar17 + 1),(BYTE *)((long)(pBVar13 + uVar10) + 4),
                               (BYTE *)iLimit,(BYTE *)piVar14,local_68);
            if (local_78->maxNbSeq <= (ulong)((long)psVar18 - (long)local_78->sequencesStart >> 3))
            goto LAB_00162185;
            if (0x20000 < local_78->maxNbLit) goto LAB_00162166;
            pBVar13 = local_78->lit;
            if (local_78->litStart + local_78->maxNbLit < pBVar13) goto LAB_00162128;
            if (iLimit < piVar17) goto LAB_00162147;
            if (local_40 < piVar17) {
              ZSTD_safecopyLiterals(pBVar13,(BYTE *)piVar17,(BYTE *)piVar17,(BYTE *)local_40);
            }
            else {
              uVar5 = *(undefined8 *)(piVar17 + 2);
              *(undefined8 *)pBVar13 = *(undefined8 *)piVar17;
              *(undefined8 *)(pBVar13 + 8) = uVar5;
            }
            psVar18 = local_78->sequences;
            psVar18->litLength = 0;
            psVar18->offBase = 1;
            if (sVar7 + 4 < 3) goto LAB_001621a4;
            if (0xffff < sVar7 + 1) {
              if (local_78->longLengthType != ZSTD_llt_none) goto LAB_001621c3;
              local_78->longLengthType = ZSTD_llt_matchLength;
              local_78->longLengthPos =
                   (U32)((ulong)((long)psVar18 - (long)local_78->sequencesStart) >> 3);
            }
            psVar18->mlBase = (U16)(sVar7 + 1);
            psVar18 = psVar18 + 1;
            local_78->sequences = psVar18;
            piVar17 = (int *)((long)piVar17 + sVar7 + 4);
            src = piVar17;
            UVar26 = UVar15;
            UVar22 = uVar25;
            local_c4 = uVar25;
            uVar25 = UVar15;
          } while (piVar17 <= local_80);
        }
      }
    } while (piVar17 < local_80);
  }
  *local_38 = UVar22;
  local_38[1] = UVar26;
  return (long)iLimit - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy_extDict_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 0);
}